

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuckoocache.h
# Opt level: O0

array<unsigned_int,_8UL> * __thiscall
CuckooCache::cache<uint256,_SignatureCacheHasher>::compute_hashes
          (cache<uint256,_SignatureCacheHasher> *this,uint256 *e)

{
  long lVar1;
  uint32_t uVar2;
  long in_RSI;
  array<unsigned_int,_8UL> *in_RDI;
  SignatureCacheHasher *this_00;
  long in_FS_OFFSET;
  array<unsigned_int,_8UL> *key;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (SignatureCacheHasher *)(in_RSI + 0x59);
  key = in_RDI;
  SignatureCacheHasher::operator()(this_00,(uint256 *)in_RDI);
  uVar2 = FastRange32((uint32_t)((ulong)key >> 0x20),(uint32_t)key);
  in_RDI->_M_elems[0] = uVar2;
  SignatureCacheHasher::operator()(this_00,(uint256 *)key);
  uVar2 = FastRange32((uint32_t)((ulong)key >> 0x20),(uint32_t)key);
  in_RDI->_M_elems[1] = uVar2;
  SignatureCacheHasher::operator()(this_00,(uint256 *)key);
  uVar2 = FastRange32((uint32_t)((ulong)key >> 0x20),(uint32_t)key);
  in_RDI->_M_elems[2] = uVar2;
  SignatureCacheHasher::operator()(this_00,(uint256 *)key);
  uVar2 = FastRange32((uint32_t)((ulong)key >> 0x20),(uint32_t)key);
  in_RDI->_M_elems[3] = uVar2;
  SignatureCacheHasher::operator()(this_00,(uint256 *)key);
  uVar2 = FastRange32((uint32_t)((ulong)key >> 0x20),(uint32_t)key);
  in_RDI->_M_elems[4] = uVar2;
  SignatureCacheHasher::operator()(this_00,(uint256 *)key);
  uVar2 = FastRange32((uint32_t)((ulong)key >> 0x20),(uint32_t)key);
  in_RDI->_M_elems[5] = uVar2;
  SignatureCacheHasher::operator()(this_00,(uint256 *)key);
  uVar2 = FastRange32((uint32_t)((ulong)key >> 0x20),(uint32_t)key);
  in_RDI->_M_elems[6] = uVar2;
  SignatureCacheHasher::operator()(this_00,(uint256 *)key);
  uVar2 = FastRange32((uint32_t)((ulong)key >> 0x20),(uint32_t)key);
  in_RDI->_M_elems[7] = uVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return key;
  }
  __stack_chk_fail();
}

Assistant:

inline std::array<uint32_t, 8> compute_hashes(const Element& e) const
    {
        return {{FastRange32(hash_function.template operator()<0>(e), size),
                 FastRange32(hash_function.template operator()<1>(e), size),
                 FastRange32(hash_function.template operator()<2>(e), size),
                 FastRange32(hash_function.template operator()<3>(e), size),
                 FastRange32(hash_function.template operator()<4>(e), size),
                 FastRange32(hash_function.template operator()<5>(e), size),
                 FastRange32(hash_function.template operator()<6>(e), size),
                 FastRange32(hash_function.template operator()<7>(e), size)}};
    }